

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O2

void bitwise_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int iVar1;
  long lVar2;
  
  if (n < 1) {
    iVar1 = 0x7ffffffe;
  }
  else {
    iVar1 = *vals;
  }
  *accum = iVar1;
  for (lVar2 = 1; lVar2 < n; lVar2 = lVar2 + 1) {
    bitwise_or_combine_accum_help(vals[lVar2],accum);
  }
  if (n < 1) {
    iVar1 = 0x7ffffffe;
  }
  else {
    iVar1 = *auxs;
  }
  *accum_aux = iVar1;
  for (lVar2 = 1; lVar2 < n; lVar2 = lVar2 + 1) {
    bitwise_or_combine_accum_help(auxs[lVar2],accum_aux);
  }
  return;
}

Assistant:

static void bitwise_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = (n > 0) ? vals[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = (n > 0) ? auxs[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		bitwise_or_combine_accum_help(auxs[i], accum_aux);
	}
}